

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  TestPartResult *pTVar1;
  Message *pMVar2;
  AssertionResult *pAVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  int i;
  int index;
  char *pcVar4;
  undefined4 in_register_00000084;
  AssertionResult AVar5;
  Message msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  String expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_58;
  AssertionResult local_50;
  String local_40;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar4 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  String::String(&local_40,pcVar4);
  Message::Message((Message *)&sStack_58);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == (Type)substr) {
      pcVar4 = strstr((pTVar1->message_).c_str_,(in_stack_00000008->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        *param_1 = '\x01';
        param_1[8] = '\0';
        param_1[9] = '\0';
        param_1[10] = '\0';
        param_1[0xb] = '\0';
        param_1[0xc] = '\0';
        param_1[0xd] = '\0';
        param_1[0xe] = '\0';
        param_1[0xf] = '\0';
        goto LAB_00162f1a;
      }
      local_50._0_4_ = local_50._0_4_ & 0xffffff00;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_50,(char (*) [11])0x179fc3);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_40);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,in_stack_00000008);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x17a7b9);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
    else {
      local_50._0_4_ = local_50._0_4_ & 0xffffff00;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_50,(char (*) [11])0x179fc3);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_40);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x17a706);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
  }
  else {
    pMVar2 = Message::operator<<((Message *)&sStack_58,(char (*) [11])0x179fc3);
    pMVar2 = Message::operator<<(pMVar2,&local_40);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x17a706);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x179fb7);
    local_50._0_4_ = SUB84((ulong)(*(long *)(this + 8) - *(long *)this) >> 6,0);
    pMVar2 = Message::operator<<(pMVar2,(int *)&local_50);
    Message::operator<<(pMVar2,(char (*) [10])" failures");
    for (index = 0; index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
        index = index + 1) {
      pMVar2 = Message::operator<<((Message *)&sStack_58,(char (*) [2])0x17a706);
      pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
      Message::operator<<(pMVar2,pTVar1);
    }
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_50,(Message *)&sStack_58);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_50.message_);
LAB_00162f1a:
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_58);
  String::~String(&local_40);
  AVar5.message_.ptr_ = extraout_RDX.ptr_;
  AVar5._0_8_ = param_1;
  return AVar5;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}